

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O1

cbtScalar gjkepa2_impl::GJK::projectorigin
                    (cbtVector3 *a,cbtVector3 *b,cbtVector3 *c,cbtVector3 *d,cbtScalar *w,U *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  cbtVector3 *b_00;
  cbtVector3 *a_00;
  cbtVector3 *b_01;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  cbtScalar cVar21;
  float fVar22;
  undefined1 auVar23 [64];
  float fVar24;
  U subm;
  cbtScalar subw [3];
  cbtVector3 dl [3];
  cbtVector3 *vt [4];
  U local_c0;
  float local_bc;
  cbtScalar local_b8 [4];
  undefined1 local_a8 [4];
  float afStack_a4 [3];
  undefined1 local_98 [8];
  float fStack_90;
  undefined1 local_88 [16];
  U *local_78;
  cbtVector3 *local_70;
  cbtVector3 *local_68;
  cbtVector3 *local_60;
  cbtVector3 *local_58 [5];
  
  local_78 = m;
  local_58[0] = a;
  local_58[1] = b;
  local_58[2] = c;
  local_58[3] = d;
  fVar1 = a->m_floats[0];
  fVar2 = a->m_floats[1];
  fVar24 = d->m_floats[0];
  fVar22 = d->m_floats[1];
  auVar20 = vinsertps_avx(ZEXT416((uint)(fVar1 - fVar24)),ZEXT416((uint)(fVar2 - fVar22)),0x10);
  fVar3 = a->m_floats[2];
  fVar4 = d->m_floats[2];
  _local_a8 = vinsertps_avx(auVar20,ZEXT416((uint)(fVar3 - fVar4)),0x28);
  auVar13 = _local_a8;
  fVar5 = b->m_floats[0];
  fVar6 = b->m_floats[1];
  auVar20 = vinsertps_avx(ZEXT416((uint)(fVar5 - fVar24)),ZEXT416((uint)(fVar6 - fVar22)),0x10);
  fVar7 = b->m_floats[2];
  _local_98 = vinsertps_avx(auVar20,ZEXT416((uint)(fVar7 - fVar4)),0x28);
  auVar14 = _local_98;
  auVar20 = vinsertps_avx(ZEXT416((uint)(c->m_floats[0] - fVar24)),
                          ZEXT416((uint)(c->m_floats[1] - fVar22)),0x10);
  local_88 = vinsertps_avx(auVar20,ZEXT416((uint)(c->m_floats[2] - fVar4)),0x28);
  auVar15 = local_88;
  auVar20 = vmulss_avx512f(ZEXT416((uint)afStack_a4[1]),ZEXT416((uint)local_98._0_4_));
  auVar20 = vmulss_avx512f(auVar20,ZEXT416((uint)local_88._4_4_));
  auVar20 = vfmadd231ss_avx512f(auVar20,ZEXT416((uint)local_88._0_4_),
                                ZEXT416((uint)(afStack_a4[0] * fStack_90)));
  auVar20 = vfnmadd213ss_avx512f
                      (ZEXT416((uint)(fStack_90 * (float)local_a8)),ZEXT416((uint)local_88._4_4_),
                       auVar20);
  auVar20 = vfnmadd213ss_fma(ZEXT416((uint)((float)local_98._0_4_ * afStack_a4[0])),
                             ZEXT416((uint)local_88._8_4_),auVar20);
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)((float)local_a8 * (float)local_98._4_4_)),
                            ZEXT416((uint)local_88._8_4_),auVar20);
  auVar20 = vfnmadd213ss_avx512f
                      (ZEXT416((uint)((float)local_98._4_4_ * afStack_a4[1])),
                       ZEXT416((uint)local_88._0_4_),auVar20);
  auVar23 = ZEXT1664(auVar20);
  fVar22 = auVar20._0_4_;
  fVar24 = -1.0;
  if (fVar22 != 0.0) {
    fVar4 = fVar5 - c->m_floats[0];
    fVar9 = fVar6 - c->m_floats[1];
    fVar10 = fVar7 - c->m_floats[2];
    auVar20 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * (fVar2 - fVar6))),ZEXT416((uint)fVar9),
                              ZEXT416((uint)(fVar3 - fVar7)));
    auVar11 = vfmsub231ss_fma(ZEXT416((uint)((fVar3 - fVar7) * fVar4)),
                              ZEXT416((uint)(fVar1 - fVar5)),ZEXT416((uint)fVar10));
    auVar12 = vfmsub231ss_fma(ZEXT416((uint)((fVar1 - fVar5) * fVar9)),ZEXT416((uint)fVar4),
                              ZEXT416((uint)(fVar2 - fVar6)));
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * auVar11._0_4_)),ZEXT416((uint)fVar1),auVar20);
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar3),auVar12);
    if (fVar22 * auVar20._0_4_ <= 0.0) {
      local_70 = c;
      local_68 = b;
      local_60 = a;
      lVar17 = 0;
      local_b8[2] = 0.0;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_c0 = 0;
      fVar24 = -1.0;
      uVar19 = 0;
      _local_a8 = auVar13;
      _local_98 = auVar14;
      local_88 = auVar15;
      do {
        uVar8 = *(uint *)((long)projectorigin::imd3 + lVar17);
        uVar18 = (ulong)uVar8;
        lVar16 = uVar18 * 0x10;
        auVar20 = vfmsub231ss_fma(ZEXT416((uint)(*(float *)(local_a8 + lVar16 + 4) *
                                                *(float *)(local_a8 + lVar17 * 4 + 8))),
                                  ZEXT416((uint)*(float *)(local_a8 + lVar17 * 4 + 4)),
                                  ZEXT416((uint)*(float *)(local_a8 + lVar16 + 8)));
        auVar13 = vfmsub231ss_fma(ZEXT416((uint)(*(float *)(local_a8 + lVar16 + 8) *
                                                *(float *)(local_a8 + lVar17 * 4))),
                                  ZEXT416((uint)*(float *)(local_a8 + lVar16)),
                                  ZEXT416((uint)*(float *)(local_a8 + lVar17 * 4 + 8)));
        auVar14 = vfmsub231ss_fma(ZEXT416((uint)(*(float *)(local_a8 + lVar16) *
                                                *(float *)(local_a8 + lVar17 * 4 + 4))),
                                  ZEXT416((uint)*(float *)(local_a8 + lVar17 * 4)),
                                  ZEXT416((uint)*(float *)(local_a8 + lVar16 + 4)));
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * d->m_floats[1])),auVar20,
                                  ZEXT416((uint)d->m_floats[0]));
        auVar20 = vfmadd231ss_fma(auVar20,auVar14,ZEXT416((uint)d->m_floats[2]));
        if (0.0 < auVar23._0_4_ * auVar20._0_4_) {
          local_bc = fVar24;
          cVar21 = projectorigin(*(cbtVector3 **)((long)local_58 + lVar17 * 2),local_58[uVar18],d,
                                 local_b8,&local_c0);
          auVar23 = ZEXT464((uint)fVar22);
          if ((local_bc < 0.0) || (fVar24 = local_bc, cVar21 < local_bc)) {
            *local_78 = (1 << (uVar8 & 0x1f) & (int)(local_c0 << 0x1e) >> 0x1f) + (local_c0 & 4) * 2
                        + (1 << (uVar19 & 0x1f) & -(local_c0 & 1));
            *(cbtScalar *)((long)w + lVar17) = local_b8[0];
            w[uVar18] = local_b8[1];
            w[projectorigin::imd3[uVar18]] = 0.0;
            w[3] = local_b8[2];
            fVar24 = cVar21;
          }
        }
        a_00 = local_68;
        b_00 = local_70;
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0xc);
      if (fVar24 < 0.0) {
        *local_78 = 0xf;
        cVar21 = det(local_70,local_68,d);
        b_01 = local_60;
        *w = cVar21 / fVar22;
        cVar21 = det(local_60,b_00,d);
        w[1] = cVar21 / fVar22;
        cVar21 = det(a_00,b_01,d);
        w[2] = cVar21 / fVar22;
        w[3] = 1.0 - (cVar21 / fVar22 + *w + w[1]);
        fVar24 = 0.0;
      }
    }
  }
  return fVar24;
}

Assistant:

static cbtScalar projectorigin(const cbtVector3& a,
								  const cbtVector3& b,
								  const cbtVector3& c,
								  const cbtVector3& d,
								  cbtScalar* w, U& m)
	{
		static const U imd3[] = {1, 2, 0};
		const cbtVector3* vt[] = {&a, &b, &c, &d};
		const cbtVector3 dl[] = {a - d, b - d, c - d};
		const cbtScalar vl = det(dl[0], dl[1], dl[2]);
		const bool ng = (vl * cbtDot(a, cbtCross(b - c, a - b))) <= 0;
		if (ng && (cbtFabs(vl) > GJK_SIMPLEX4_EPS))
		{
			cbtScalar mindist = -1;
			cbtScalar subw[3] = {0.f, 0.f, 0.f};
			U subm(0);
			for (U i = 0; i < 3; ++i)
			{
				const U j = imd3[i];
				const cbtScalar s = vl * cbtDot(d, cbtCross(dl[i], dl[j]));
				if (s > 0)
				{
					const cbtScalar subd = projectorigin(*vt[i], *vt[j], d, subw, subm);
					if ((mindist < 0) || (subd < mindist))
					{
						mindist = subd;
						m = static_cast<U>((subm & 1 ? 1 << i : 0) +
										   (subm & 2 ? 1 << j : 0) +
										   (subm & 4 ? 8 : 0));
						w[i] = subw[0];
						w[j] = subw[1];
						w[imd3[j]] = 0;
						w[3] = subw[2];
					}
				}
			}
			if (mindist < 0)
			{
				mindist = 0;
				m = 15;
				w[0] = det(c, b, d) / vl;
				w[1] = det(a, c, d) / vl;
				w[2] = det(b, a, d) / vl;
				w[3] = 1 - (w[0] + w[1] + w[2]);
			}
			return (mindist);
		}
		return (-1);
	}